

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O3

iterator * __thiscall ghc::filesystem::path::iterator::operator++(iterator *this)

{
  char *pcVar1;
  const_iterator cVar2;
  
  cVar2 = increment(this,&this->_iter);
  pcVar1 = (this->_last)._M_current;
  do {
    (this->_iter)._M_current = cVar2._M_current;
    if (((cVar2._M_current == pcVar1) || (cVar2._M_current == (this->_root)._M_current)) ||
       (*cVar2._M_current != '/')) break;
    cVar2._M_current = cVar2._M_current + 1;
  } while (cVar2._M_current != pcVar1);
  updateCurrent(this);
  return this;
}

Assistant:

GHC_INLINE path::iterator& path::iterator::operator++()
{
    _iter = increment(_iter);
    while (_iter != _last &&                 // we didn't reach the end
           _iter != _root &&                 // this is not a root position
           *_iter == preferred_separator &&  // we are on a separator
           (_iter + 1) != _last              // the slash is not the last char
    ) {
        ++_iter;
    }
    updateCurrent();
    return *this;
}